

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_profile.c
# Opt level: O3

void profile_signal(int sig)

{
  int iVar1;
  global_State *g;
  
  g = profile_state.g;
  profile_state.samples = profile_state.samples + 1;
  if ((profile_state.g)->hookmask < 0x20) {
    iVar1 = (profile_state.g)->vmstate;
    profile_state.vmstate = 0x4e;
    if (iVar1 < 0) {
      if (iVar1 == -2) {
        profile_state.vmstate = 0x43;
      }
      else {
        profile_state.vmstate = 0x49;
        if (iVar1 != -1) {
          profile_state.vmstate = (uint)(iVar1 != -3) * 3 + 0x47;
        }
      }
    }
    (profile_state.g)->hookmask = (profile_state.g)->hookmask | 0x80;
    lj_dispatch_update(g);
    return;
  }
  return;
}

Assistant:

static void profile_trigger(ProfileState *ps)
{
  global_State *g = ps->g;
  uint8_t mask;
  profile_lock(ps);
  ps->samples++;  /* Always increment number of samples. */
  mask = g->hookmask;
  if (!(mask & (HOOK_PROFILE|HOOK_VMEVENT|HOOK_GC))) {  /* Set profile hook. */
    int st = g->vmstate;
    ps->vmstate = st >= 0 ? 'N' :
		  st == ~LJ_VMST_INTERP ? 'I' :
		  st == ~LJ_VMST_C ? 'C' :
		  st == ~LJ_VMST_GC ? 'G' : 'J';
    g->hookmask = (mask | HOOK_PROFILE);
    lj_dispatch_update(g);
  }
  profile_unlock(ps);
}